

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

VkResult vkb::detail::get_vector<VkLayerProperties,VkResult(*&)(unsigned_int*,VkLayerProperties*)>
                   (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *out,
                   _func_VkResult_uint_ptr_VkLayerProperties_ptr **f)

{
  _func_VkResult_uint_ptr_VkLayerProperties_ptr *p_Var1;
  VkResult VVar2;
  VkLayerProperties *pVVar3;
  uint local_24;
  VkResult err;
  uint32_t count;
  _func_VkResult_uint_ptr_VkLayerProperties_ptr **f_local;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *out_local;
  
  local_24 = 0;
  _err = f;
  f_local = (_func_VkResult_uint_ptr_VkLayerProperties_ptr **)out;
  do {
    VVar2 = (**_err)(&local_24,(VkLayerProperties *)0x0);
    if (VVar2 != VK_SUCCESS) {
      return VVar2;
    }
    std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
              ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)f_local,
               (ulong)local_24);
    p_Var1 = *_err;
    pVVar3 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::data
                       ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)f_local);
    VVar2 = (*p_Var1)(&local_24,pVVar3);
    std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
              ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)f_local,
               (ulong)local_24);
  } while (VVar2 == VK_INCOMPLETE);
  return VVar2;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}